

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  bool bVar1;
  char *p_00;
  int *curLineNumPtr_local;
  StrPair *parentEndTag_local;
  char *p_local;
  XMLElement *this_local;
  
  parentEndTag_local = (StrPair *)XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
  if ((char)parentEndTag_local->_flags == '/') {
    this->_closingType = CLOSING;
    parentEndTag_local = (StrPair *)((long)&parentEndTag_local->_flags + 1);
  }
  p_00 = StrPair::ParseName(&(this->super_XMLNode)._value,(char *)parentEndTag_local);
  bVar1 = StrPair::Empty(&(this->super_XMLNode)._value);
  if (bVar1) {
    this_local = (XMLElement *)0x0;
  }
  else {
    this_local = (XMLElement *)ParseAttributes(this,p_00,curLineNumPtr);
    if (((this_local != (XMLElement *)0x0) &&
        (*(char *)&(this_local->super_XMLNode)._vptr_XMLNode != '\0')) &&
       (this->_closingType == OPEN)) {
      this_local = (XMLElement *)
                   XMLNode::ParseDeep(&this->super_XMLNode,(char *)this_local,parentEndTag,
                                      curLineNumPtr);
    }
  }
  return (char *)this_local;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* parentEndTag, int* curLineNumPtr )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p, curLineNumPtr );
    if ( !p || !*p || _closingType != OPEN ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, parentEndTag, curLineNumPtr );
    return p;
}